

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

openssh_new_key * load_openssh_new_key(BinarySource *filesrc,char **errmsg_p)

{
  ptrlen pl;
  ptrlen pl_00;
  _Bool _Var1;
  int iVar2;
  openssh_new_key *b;
  strbuf *psVar3;
  char *pcVar4;
  unsigned_long uVar5;
  size_t sVar6;
  bool bVar7;
  ptrlen pVar8;
  void *local_138;
  size_t local_130;
  void *local_128;
  void *local_120;
  void *local_118;
  size_t local_110;
  undefined1 local_108 [8];
  BinarySource opts [1];
  void *local_d8;
  void *pvStack_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  uchar local_8f [3];
  int len;
  uchar out [3];
  void *pvStack_88;
  uint key_index;
  ptrlen str;
  BinarySource src [1];
  int local_48;
  char local_44 [4];
  int base64_chars;
  char base64_bit [4];
  char *p;
  char *errmsg;
  char *line;
  openssh_new_key *ret;
  char **errmsg_p_local;
  BinarySource *filesrc_local;
  
  local_48 = 0;
  b = (openssh_new_key *)safemalloc(1,0x40,0);
  psVar3 = strbuf_new_nm();
  b->keyblob = psVar3;
  errmsg = bsgetline(filesrc);
  if (errmsg == (char *)0x0) {
    p = "unexpected end of file";
  }
  else {
    iVar2 = strcmp(errmsg,"-----BEGIN OPENSSH PRIVATE KEY-----");
    if (iVar2 == 0) {
      sVar6 = strlen(errmsg);
      smemclr(errmsg,sVar6);
      safefree(errmsg);
      while (errmsg = bsgetline(filesrc), errmsg != (char *)0x0) {
        iVar2 = strcmp(errmsg,"-----END OPENSSH PRIVATE KEY-----");
        pcVar4 = errmsg;
        if (iVar2 == 0) {
          safefree(errmsg);
          errmsg = (char *)0x0;
          if (b->keyblob->len == 0) {
            p = "key body not present";
            goto LAB_0011a91c;
          }
          pVar8 = ptrlen_from_strbuf(b->keyblob);
          BinarySource_INIT__((BinarySource *)&str.len,pVar8);
          pcVar4 = BinarySource_get_asciz((BinarySource *)src[0]._24_8_);
          iVar2 = strcmp(pcVar4,"openssh-key-v1");
          if (iVar2 != 0) {
            p = "new-style OpenSSH magic number missing\n";
            goto LAB_0011a91c;
          }
          pVar8 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
          local_b8 = pVar8.ptr;
          pvStack_88 = local_b8;
          local_b0 = (void *)pVar8.len;
          str.ptr = local_b0;
          _Var1 = ptrlen_eq_string(pVar8,"none");
          if (_Var1) {
            b->cipher = ON_E_NONE;
          }
          else {
            pVar8.len = (size_t)str.ptr;
            pVar8.ptr = pvStack_88;
            _Var1 = ptrlen_eq_string(pVar8,"aes256-cbc");
            if (_Var1) {
              b->cipher = ON_E_AES256CBC;
            }
            else {
              pl.len = (size_t)str.ptr;
              pl.ptr = pvStack_88;
              _Var1 = ptrlen_eq_string(pl,"aes256-ctr");
              if (!_Var1) {
                p = "unrecognised cipher name\n";
                if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
                  p = "no cipher name found";
                }
                goto LAB_0011a91c;
              }
              b->cipher = ON_E_AES256CTR;
            }
          }
          pVar8 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
          local_c8 = pVar8.ptr;
          pvStack_88 = local_c8;
          local_c0 = (void *)pVar8.len;
          str.ptr = local_c0;
          _Var1 = ptrlen_eq_string(pVar8,"none");
          if (_Var1) {
            b->kdf = ON_K_NONE;
          }
          else {
            pl_00.len = (size_t)str.ptr;
            pl_00.ptr = pvStack_88;
            _Var1 = ptrlen_eq_string(pl_00,"bcrypt");
            if (!_Var1) {
              p = "unrecognised kdf name\n";
              if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
                p = "no kdf name found";
              }
              goto LAB_0011a91c;
            }
            b->kdf = ON_K_BCRYPT;
          }
          pVar8 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
          local_d8 = pVar8.ptr;
          pvStack_d0 = (void *)pVar8.len;
          pvStack_88 = local_d8;
          str.ptr = pvStack_d0;
          if (b->kdf == ON_K_NONE) {
            if (pvStack_d0 != (void *)0x0) {
              p = "expected empty options string for \'none\' kdf";
              goto LAB_0011a91c;
            }
          }
          else if (b->kdf == ON_K_BCRYPT) {
            BinarySource_INIT__((BinarySource *)local_108,pVar8);
            pVar8 = BinarySource_get_string((BinarySource *)opts[0]._24_8_);
            local_118 = pVar8.ptr;
            (b->kdfopts).bcrypt.salt.ptr = local_118;
            local_110 = pVar8.len;
            (b->kdfopts).bcrypt.salt.len = local_110;
            uVar5 = BinarySource_get_uint32((BinarySource *)opts[0]._24_8_);
            (b->kdfopts).bcrypt.rounds = (int)uVar5;
            if (*(int *)(opts[0]._24_8_ + 0x18) != 0) {
              p = "failed to parse bcrypt options string";
              goto LAB_0011a91c;
            }
          }
          uVar5 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
          iVar2 = toint((uint)uVar5);
          b->nkeys = iVar2;
          if (b->nkeys == 1) {
            b->key_wanted = 0;
            for (len = 0; (uint)len < (uint)b->nkeys; len = len + 1) {
              pVar8 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
              local_128 = pVar8.ptr;
              pvStack_88 = local_128;
              local_120 = (void *)pVar8.len;
              str.ptr = local_120;
            }
            pVar8 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
            local_138 = pVar8.ptr;
            (b->private).ptr = local_138;
            local_130 = pVar8.len;
            (b->private).len = local_130;
            if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
              smemclr(local_44,4);
              if (errmsg_p == (char **)0x0) {
                return b;
              }
              *errmsg_p = (char *)0x0;
              return b;
            }
            p = "no private key container string found\n";
          }
          else {
            p = "multiple keys in new-style OpenSSH key file not supported\n";
            if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
              p = "no key count found";
            }
          }
          goto LAB_0011a91c;
        }
        while( true ) {
          _base64_chars = pcVar4;
          if (((((*_base64_chars < 'A') || (bVar7 = true, 'Z' < *_base64_chars)) &&
               ((*_base64_chars < 'a' || (bVar7 = true, 'z' < *_base64_chars)))) &&
              (((*_base64_chars < '0' || (bVar7 = true, '9' < *_base64_chars)) &&
               (bVar7 = true, *_base64_chars != '+')))) && (bVar7 = true, *_base64_chars != '/')) {
            bVar7 = *_base64_chars == '=';
          }
          if (!bVar7) break;
          iVar2 = local_48 + 1;
          local_44[local_48] = *_base64_chars;
          local_48 = iVar2;
          if (iVar2 == 4) {
            local_48 = 0;
            iVar2 = base64_decode_atom(local_44,local_8f);
            if (iVar2 < 1) {
              p = "invalid base64 encoding";
              goto LAB_0011a91c;
            }
            BinarySink_put_data(b->keyblob->binarysink_,local_8f,(long)iVar2);
            smemclr(local_8f,3);
          }
          pcVar4 = _base64_chars + 1;
        }
        sVar6 = strlen(errmsg);
        smemclr(errmsg,sVar6);
        safefree(errmsg);
      }
      p = "unexpected end of file";
    }
    else {
      p = "file does not begin with OpenSSH new-style key header";
    }
  }
LAB_0011a91c:
  if (errmsg != (char *)0x0) {
    sVar6 = strlen(errmsg);
    smemclr(errmsg,sVar6);
    safefree(errmsg);
  }
  smemclr(local_44,4);
  if (b != (openssh_new_key *)0x0) {
    strbuf_free(b->keyblob);
    smemclr(b,0x40);
    safefree(b);
  }
  if (errmsg_p != (char **)0x0) {
    *errmsg_p = p;
  }
  return (openssh_new_key *)0x0;
}

Assistant:

static struct openssh_new_key *load_openssh_new_key(BinarySource *filesrc,
                                                    const char **errmsg_p)
{
    struct openssh_new_key *ret;
    char *line = NULL;
    const char *errmsg;
    char *p;
    char base64_bit[4];
    int base64_chars = 0;
    BinarySource src[1];
    ptrlen str;
    unsigned key_index;

    ret = snew(struct openssh_new_key);
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(filesrc))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "-----BEGIN OPENSSH PRIVATE KEY-----")) {
        errmsg = "file does not begin with OpenSSH new-style key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    while (1) {
        if (!(line = bsgetline(filesrc))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (0 == strcmp(line, "-----END OPENSSH PRIVATE KEY-----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }

        p = line;
        while (isbase64(*p)) {
            base64_bit[base64_chars++] = *p;
            if (base64_chars == 4) {
                unsigned char out[3];
                int len;

                base64_chars = 0;

                len = base64_decode_atom(base64_bit, out);

                if (len <= 0) {
                    errmsg = "invalid base64 encoding";
                    goto error;
                }

                put_data(ret->keyblob, out, len);

                smemclr(out, sizeof(out));
            }

            p++;
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(ret->keyblob));

    if (strcmp(get_asciz(src), "openssh-key-v1") != 0) {
        errmsg = "new-style OpenSSH magic number missing\n";
        goto error;
    }

    /* Cipher name */
    str = get_string(src);
    if (ptrlen_eq_string(str, "none")) {
        ret->cipher = ON_E_NONE;
    } else if (ptrlen_eq_string(str, "aes256-cbc")) {
        ret->cipher = ON_E_AES256CBC;
    } else if (ptrlen_eq_string(str, "aes256-ctr")) {
        ret->cipher = ON_E_AES256CTR;
    } else {
        errmsg = get_err(src) ? "no cipher name found" :
            "unrecognised cipher name\n";
        goto error;
    }

    /* Key derivation function name */
    str = get_string(src);
    if (ptrlen_eq_string(str, "none")) {
        ret->kdf = ON_K_NONE;
    } else if (ptrlen_eq_string(str, "bcrypt")) {
        ret->kdf = ON_K_BCRYPT;
    } else {
        errmsg = get_err(src) ? "no kdf name found" :
            "unrecognised kdf name\n";
        goto error;
    }

    /* KDF extra options */
    str = get_string(src);
    switch (ret->kdf) {
      case ON_K_NONE:
        if (str.len != 0) {
            errmsg = "expected empty options string for 'none' kdf";
            goto error;
        }
        break;
      case ON_K_BCRYPT: {
        BinarySource opts[1];

        BinarySource_BARE_INIT_PL(opts, str);
        ret->kdfopts.bcrypt.salt = get_string(opts);
        ret->kdfopts.bcrypt.rounds = get_uint32(opts);

        if (get_err(opts)) {
          errmsg = "failed to parse bcrypt options string";
          goto error;
        }
        break;
      }
    }

    /*
     * At this point we expect a uint32 saying how many keys are
     * stored in this file. OpenSSH new-style key files can
     * contain more than one. Currently we don't have any user
     * interface to specify which one we're trying to extract, so
     * we just bomb out with an error if more than one is found in
     * the file. However, I've put in all the mechanism here to
     * extract the nth one for a given n, in case we later connect
     * up some UI to that mechanism. Just arrange that the
     * 'key_wanted' field is set to a value in the range [0,
     * nkeys) by some mechanism.
     */
    ret->nkeys = toint(get_uint32(src));
    if (ret->nkeys != 1) {
        errmsg = get_err(src) ? "no key count found" :
            "multiple keys in new-style OpenSSH key file not supported\n";
        goto error;
    }
    ret->key_wanted = 0;

    /* Read and ignore a string per public key. */
    for (key_index = 0; key_index < ret->nkeys; key_index++)
        str = get_string(src);

    /*
     * Now we expect a string containing the encrypted part of the
     * key file.
     */
    ret->private = get_string(src);
    if (get_err(src)) {
        errmsg = "no private key container string found\n";
        goto error;
    }

    /*
     * And now we're done, until asked to actually decrypt.
     */

    smemclr(base64_bit, sizeof(base64_bit));
    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    smemclr(base64_bit, sizeof(base64_bit));
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}